

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyclichash.h
# Opt level: O2

uint __thiscall
CyclicHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (CyclicHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  CyclicHash<unsigned_int,unsigned_char> CVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  byte *pbVar5;
  uint uVar6;
  
  uVar6 = 0;
  uVar3 = 0;
  while( true ) {
    sVar4 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
    if (sVar4 <= uVar3) break;
    uVar2 = *(uint *)(this + 0x40c);
    CVar1 = this[8];
    pbVar5 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[]
                       (&(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Deque_impl_data._M_start,(ulong)uVar3);
    uVar6 = (uVar6 >> ((char)CVar1 - 1U & 0x1f) | (uVar2 & uVar6) * 2) ^
            *(uint *)(this + (ulong)*pbVar5 * 4 + 0xc);
    uVar3 = uVar3 + 1;
  }
  return uVar6;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift1(answer);
      answer ^= hasher.hashvalues[static_cast<unsigned int>(c[k])];
    }
    return answer;
  }